

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9MuxPos(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Gia_Man_t *pNew;
  char *pcVar3;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"vh"), iVar2 == 0x76) {
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (iVar2 == -1) {
    if (pAbc->pGia != (Gia_Man_t *)0x0) {
      pNew = Gia_ManDupWithMuxPos(pAbc->pGia);
      Abc_FrameUpdateGia(pAbc,pNew);
      return 0;
    }
    pcVar3 = "Abc_CommandAbc9MuxPos(): There is no AIG.\n";
    iVar2 = -1;
  }
  else {
    Abc_Print(-2,"usage: &muxpos [-vh]\n");
    Abc_Print(-2,"\t         create additional POs to preserve MUXes\n");
    pcVar3 = "yes";
    if (!bVar1) {
      pcVar3 = "no";
    }
    Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
    pcVar3 = "\t-h     : print the command usage\n";
    iVar2 = -2;
  }
  Abc_Print(iVar2,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandAbc9MuxPos( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManDupWithMuxPos( Gia_Man_t * p );
    Gia_Man_t * pGia;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9MuxPos(): There is no AIG.\n" );
        return 1;
    }
    pGia = Gia_ManDupWithMuxPos( pAbc->pGia );
    Abc_FrameUpdateGia( pAbc, pGia );
    return 0;

usage:
    Abc_Print( -2, "usage: &muxpos [-vh]\n" );
    Abc_Print( -2, "\t         create additional POs to preserve MUXes\n" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}